

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_keys.cpp
# Opt level: O2

bool __thiscall OneKey::check(OneKey *this,AActor *owner)

{
  PClassActor *pPVar1;
  bool bVar2;
  PClassActor *pPVar3;
  AInventory *this_00;
  int local_30;
  int local_2c;
  
  bVar2 = DObject::IsKindOf((DObject *)owner,AKey::RegistrationInfo.MyClass);
  if (bVar2) {
    pPVar1 = this->key;
    pPVar3 = (PClassActor *)DObject::GetClass((DObject *)owner);
    if (pPVar3 == pPVar1) {
      bVar2 = true;
    }
    else {
      (*(owner->super_DThinker).super_DObject._vptr_DObject[0x21])(&local_2c,owner);
      bVar2 = local_2c == (this->key->super_PClass).super_PStruct.super_PNamedType.TypeName.Index;
    }
  }
  else {
    this_00 = GC::ReadBarrier<AInventory>((AInventory **)&owner->Inventory);
    for (; bVar2 = this_00 != (AInventory *)0x0, bVar2;
        this_00 = GC::ReadBarrier<AInventory>((AInventory **)&(this_00->super_AActor).Inventory)) {
      pPVar1 = this->key;
      pPVar3 = (PClassActor *)DObject::GetClass((DObject *)this_00);
      if (pPVar3 == pPVar1) {
        return bVar2;
      }
      (*(this_00->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x21])(&local_30,this_00)
      ;
      if (local_30 == (this->key->super_PClass).super_PStruct.super_PNamedType.TypeName.Index) {
        return bVar2;
      }
    }
  }
  return bVar2;
}

Assistant:

bool check(AActor *owner)
	{
		if (owner->IsKindOf(RUNTIME_CLASS(AKey)))
		{
			// P_GetMapColorForKey() checks the key directly
			return owner->IsA(key) || owner->GetSpecies() == key->TypeName;
		}
		else 
		{
			// Other calls check an actor that may have a key in its inventory.
			AInventory *item;

			for (item = owner->Inventory; item != NULL; item = item->Inventory)
			{
				if (item->IsA(key))
				{
					return true;
				}
				else if (item->GetSpecies() == key->TypeName)
				{
					return true;
				}
			}
			return false;
		}
	}